

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::record_application_info(StateRecorder *this,VkApplicationInfo *info)

{
  void *pvVar1;
  int iVar2;
  Hash HVar3;
  Impl *pIVar4;
  mutex *__mutex;
  string local_40;
  
  pvVar1 = info->pNext;
  if (pvVar1 == (void *)0x0) {
    __mutex = &this->impl->record_lock;
    pIVar4 = (Impl *)__mutex;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    Impl::copy_application_info(pIVar4,info,&this->impl->allocator,&this->impl->application_info);
    pIVar4 = this->impl;
    HVar3 = Hashing::compute_hash_application_info(pIVar4->application_info);
    (pIVar4->application_feature_hash).application_info_hash = HVar3;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"pNext in VkApplicationInfo not supported.","");
    log_error_pnext_chain(&local_40,info->pNext);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return pvVar1 == (void *)0x0;
}

Assistant:

bool StateRecorder::record_application_info(const VkApplicationInfo &info)
{
	if (info.pNext)
	{
		log_error_pnext_chain("pNext in VkApplicationInfo not supported.", info.pNext);
		return false;
	}

	std::lock_guard<std::mutex> lock(impl->record_lock);
	if (!impl->copy_application_info(&info, impl->allocator, &impl->application_info))
		return false;
	impl->application_feature_hash.application_info_hash = Hashing::compute_hash_application_info(*impl->application_info);
	return true;
}